

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamAux.h
# Opt level: O0

void __thiscall BamTools::CustomHeaderTag::~CustomHeaderTag(CustomHeaderTag *this)

{
  string *in_RDI;
  
  std::__cxx11::string::~string(in_RDI + 0x20);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

struct API_EXPORT CustomHeaderTag
{
    std::string TagName;
    std::string TagValue;
}